

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getAutoVacuum(char *z)

{
  uint in_EAX;
  uint uVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  byte bVar5;
  byte *pbVar6;
  int x;
  undefined8 uStack_18;
  
  bVar4 = *z;
  bVar5 = bVar4;
  if (bVar4 == 0) {
    pbVar2 = (byte *)0x1aa8f2;
  }
  else {
    pbVar6 = (byte *)(z + 1);
    pbVar2 = (byte *)0x1aa8f2;
    do {
      if (""[bVar5] != ""[*pbVar2]) break;
      pbVar2 = pbVar2 + 1;
      bVar5 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar5 != 0);
  }
  uVar1 = 0;
  if (""[bVar5] != ""[*pbVar2]) {
    bVar5 = bVar4;
    if (bVar4 == 0) {
      pbVar2 = (byte *)0x1ae638;
    }
    else {
      pbVar6 = (byte *)(z + 1);
      pbVar2 = (byte *)0x1ae638;
      do {
        if (""[bVar5] != ""[*pbVar2]) break;
        pbVar2 = pbVar2 + 1;
        bVar5 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (bVar5 != 0);
    }
    uVar1 = 1;
    if (""[bVar5] != ""[*pbVar2]) {
      if (bVar4 == 0) {
        pcVar3 = "incremental";
      }
      else {
        pbVar2 = (byte *)(z + 1);
        pcVar3 = "incremental";
        do {
          if (""[bVar4] != ""[(byte)*pcVar3]) break;
          pcVar3 = (char *)((byte *)pcVar3 + 1);
          bVar4 = *pbVar2;
          pbVar2 = pbVar2 + 1;
        } while (bVar4 != 0);
      }
      uVar1 = 2;
      if (""[bVar4] != ""[(byte)*pcVar3]) {
        uStack_18 = (ulong)in_EAX;
        sqlite3GetInt32(z,(int *)((long)&uStack_18 + 4));
        uVar1 = uStack_18._4_4_ & 0xff;
        if (2 < uStack_18._4_4_) {
          uVar1 = 0;
        }
      }
    }
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_stricmp(const char *zLeft, const char *zRight){
  register unsigned char *a, *b;
  a = (unsigned char *)zLeft;
  b = (unsigned char *)zRight;
  while( *a!=0 && UpperToLower[*a]==UpperToLower[*b]){ a++; b++; }
  return UpperToLower[*a] - UpperToLower[*b];
}